

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void convert_dtype<unsigned_long,unsigned_int>
               (void *ptr_write_,vector<char,_std::allocator<char>_> *buffer,size_t n_els)

{
  char *pcVar1;
  ulong in_RDX;
  long in_RDI;
  size_t el;
  uint *ptr_read;
  unsigned_long *ptr_write;
  ulong local_30;
  
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x65ec17);
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    *(ulong *)(in_RDI + local_30 * 8) = (ulong)*(uint *)(pcVar1 + local_30 * 4);
  }
  return;
}

Assistant:

void convert_dtype(void *ptr_write_, std::vector<char> &buffer, size_t n_els)
{
    dtype *ptr_write = (dtype*)ptr_write_;
    saved_type *ptr_read = (saved_type*)buffer.data();

    if ((sizeof(dtype) <= sizeof(saved_type)) &&
        (saved_type)std::numeric_limits<dtype>::max() < std::numeric_limits<saved_type>::max())
    {
        const saved_type maxval = (saved_type) std::numeric_limits<dtype>::max();
        for (size_t el = 0; el < n_els; el++)
            if (unlikely(ptr_read[el] > maxval))
                throw std::runtime_error("Error: serialized model has values too large for the current machine's types.\n");
    }

    for (size_t el = 0; el < n_els; el++)
        ptr_write[el] = (dtype)ptr_read[el];
}